

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaExpandAttributeGroupRefs
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaBasicItemPtr item,
              xmlSchemaWildcardPtr *completeWild,xmlSchemaItemListPtr list,
              xmlSchemaItemListPtr prohibs)

{
  long lVar1;
  xmlSchemaPtr schema;
  xmlSchemaBasicItemPtr pxVar2;
  int iVar3;
  xmlNodePtr pxVar4;
  xmlChar *str1;
  xmlChar *local_78;
  xmlChar *str;
  xmlSchemaAttributeUseProhibPtr prohib;
  xmlSchemaWildcardPtr tmpWild;
  int local_58;
  int created;
  int j;
  int i;
  xmlSchemaItemListPtr sublist;
  xmlSchemaAttributeUsePtr_conflict use;
  xmlSchemaAttributeGroupPtr_conflict gr;
  xmlSchemaItemListPtr prohibs_local;
  xmlSchemaItemListPtr list_local;
  xmlSchemaWildcardPtr *completeWild_local;
  xmlSchemaBasicItemPtr item_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  tmpWild._4_4_ = (uint)(*completeWild != (xmlSchemaWildcardPtr)0x0);
  if (prohibs != (xmlSchemaItemListPtr)0x0) {
    prohibs->nbItems = 0;
  }
  gr = (xmlSchemaAttributeGroupPtr_conflict)prohibs;
  prohibs_local = list;
  list_local = (xmlSchemaItemListPtr)completeWild;
  completeWild_local = (xmlSchemaWildcardPtr *)item;
  item_local = (xmlSchemaBasicItemPtr)pctxt;
  for (created = 0; created < prohibs_local->nbItems; created = created + 1) {
    sublist = (xmlSchemaItemListPtr)prohibs_local->items[created];
    if (*(int *)&sublist->items == 0x7d1) {
      if (gr == (xmlSchemaAttributeGroupPtr_conflict)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)item_local,"xmlSchemaExpandAttributeGroupRefs",
                   "unexpected attr prohibition found");
        return -1;
      }
      iVar3 = xmlSchemaItemListRemove(prohibs_local,created);
      if (iVar3 == -1) {
        return -1;
      }
      created = created + -1;
      xmlSchemaItemListAddSize((xmlSchemaItemListPtr)gr,2,sublist);
    }
    else if ((*(int *)&sublist->items == 2000) && (*(int *)&sublist[1].items == 0x10)) {
      lVar1._0_4_ = sublist->nbItems;
      lVar1._4_4_ = sublist->sizeItems;
      if (lVar1 == 0) {
        return -1;
      }
      use = *(xmlSchemaAttributeUsePtr_conflict *)&sublist->nbItems;
      if (((((xmlSchemaAttributeGroupPtr_conflict)use)->flags & 1U) == 0) &&
         (iVar3 = xmlSchemaAttributeGroupExpandRefs
                            ((xmlSchemaParserCtxtPtr)item_local,
                             (xmlSchemaAttributeGroupPtr_conflict)use), iVar3 == -1)) {
        return -1;
      }
      pxVar2 = item_local;
      if (use[1].annot != (xmlSchemaAnnotPtr)0x0) {
        if (list_local->items == (void **)0x0) {
          list_local->items = &(use[1].annot)->next;
        }
        else {
          if (tmpWild._4_4_ == 0) {
            schema = *(xmlSchemaPtr *)(item_local + 4);
            pxVar4 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)completeWild_local);
            prohib = (xmlSchemaAttributeUseProhibPtr)
                     xmlSchemaAddWildcard
                               ((xmlSchemaParserCtxtPtr)pxVar2,schema,XML_SCHEMA_TYPE_ANY_ATTRIBUTE,
                                pxVar4);
            if ((xmlSchemaWildcardPtr)prohib == (xmlSchemaWildcardPtr)0x0) {
              return -1;
            }
            iVar3 = xmlSchemaCloneWildcardNsConstraints
                              ((xmlSchemaParserCtxtPtr)item_local,(xmlSchemaWildcardPtr)prohib,
                               (xmlSchemaWildcardPtr)list_local->items);
            if (iVar3 == -1) {
              return -1;
            }
            prohib[1].type = *(xmlSchemaTypeType *)(list_local->items + 5);
            list_local->items = (void **)prohib;
            tmpWild._4_4_ = 1;
          }
          iVar3 = xmlSchemaIntersectWildcards
                            ((xmlSchemaParserCtxtPtr)item_local,
                             (xmlSchemaWildcardPtr)list_local->items,
                             (xmlSchemaWildcardPtr)use[1].annot);
          if (iVar3 == -1) {
            return -1;
          }
        }
      }
      _j = use[1].node;
      if ((_j == (xmlNodePtr)0x0) || (_j->type == 0)) {
        iVar3 = xmlSchemaItemListRemove(prohibs_local,created);
        if (iVar3 == -1) {
          return -1;
        }
        created = created + -1;
      }
      else {
        prohibs_local->items[created] = *_j->_private;
        if (_j->type != XML_ELEMENT_NODE) {
          for (local_58 = 1; local_58 < (int)_j->type; local_58 = local_58 + 1) {
            created = created + 1;
            iVar3 = xmlSchemaItemListInsert
                              (prohibs_local,*(void **)((long)_j->_private + (long)local_58 * 8),
                               created);
            if (iVar3 == -1) {
              return -1;
            }
          }
        }
      }
    }
  }
  if (((gr == (xmlSchemaAttributeGroupPtr_conflict)0x0) || (*(int *)&gr->next == 0)) ||
     (prohibs_local->nbItems == 0)) {
    return 0;
  }
  created = *(int *)&gr->next;
  do {
    pxVar2 = item_local;
    created = created + -1;
    if (created < 0) {
      return 0;
    }
    str = *(xmlChar **)(*(long *)gr + (long)created * 8);
    for (local_58 = 0; local_58 < prohibs_local->nbItems; local_58 = local_58 + 1) {
      sublist = (xmlSchemaItemListPtr)prohibs_local->items[local_58];
      if ((*(long *)(str + 0x10) == *(long *)(*(long *)&sublist[1].nbItems + 0x10)) &&
         (*(long *)(str + 0x18) == *(long *)(*(long *)&sublist[1].nbItems + 0x70))) {
        local_78 = (xmlChar *)0x0;
        pxVar4 = *(xmlNodePtr *)(str + 8);
        str1 = xmlSchemaFormatQName(&local_78,*(xmlChar **)(str + 0x18),*(xmlChar **)(str + 0x10));
        xmlSchemaCustomWarning
                  ((xmlSchemaAbstractCtxtPtr)pxVar2,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,pxVar4,
                   (xmlSchemaTypePtr)0x0,
                   "Skipping pointless attribute use prohibition \'%s\', since a corresponding attribute use exists already in the type definition"
                   ,str1,(xmlChar *)0x0,(xmlChar *)0x0);
        if (local_78 != (xmlChar *)0x0) {
          (*xmlFree)(local_78);
          local_78 = (xmlChar *)0x0;
        }
        iVar3 = xmlSchemaItemListRemove((xmlSchemaItemListPtr)gr,created);
        if (iVar3 == -1) {
          return -1;
        }
        break;
      }
    }
  } while( true );
}

Assistant:

static int
xmlSchemaExpandAttributeGroupRefs(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaBasicItemPtr item,
				  xmlSchemaWildcardPtr *completeWild,
				  xmlSchemaItemListPtr list,
				  xmlSchemaItemListPtr prohibs)
{
    xmlSchemaAttributeGroupPtr gr;
    xmlSchemaAttributeUsePtr use;
    xmlSchemaItemListPtr sublist;
    int i, j;
    int created = (*completeWild == NULL) ? 0 : 1;

    if (prohibs)
	prohibs->nbItems = 0;

    for (i = 0; i < list->nbItems; i++) {
	use = list->items[i];

	if (use->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
	    if (prohibs == NULL) {
		PERROR_INT("xmlSchemaExpandAttributeGroupRefs",
		    "unexpected attr prohibition found");
		return(-1);
	    }
	    /*
	    * Remove from attribute uses.
	    */
	    if (xmlSchemaItemListRemove(list, i) == -1)
		return(-1);
	    i--;
	    /*
	    * Note that duplicate prohibitions were already
	    * handled at parsing time.
	    */
	    /*
	    * Add to list of prohibitions.
	    */
	    xmlSchemaItemListAddSize(prohibs, 2, use);
	    continue;
	}
	if ((use->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
	    ((WXS_QNAME_CAST use)->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP))
	{
	    if ((WXS_QNAME_CAST use)->item == NULL)
		return(-1);
	    gr = WXS_ATTR_GROUP_CAST (WXS_QNAME_CAST use)->item;
	    /*
	    * Expand the referenced attr. group.
	    * TODO: remove this, this is done in a previous step, so
	    * already done here.
	    */
	    if ((gr->flags & XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED) == 0) {
		if (xmlSchemaAttributeGroupExpandRefs(pctxt, gr) == -1)
		    return(-1);
	    }
	    /*
	    * Build the 'complete' wildcard; i.e. intersect multiple
	    * wildcards.
	    */
	    if (gr->attributeWildcard != NULL) {
		if (*completeWild == NULL) {
		    *completeWild = gr->attributeWildcard;
		} else {
		    if (! created) {
			xmlSchemaWildcardPtr tmpWild;

			 /*
			* Copy the first encountered wildcard as context,
			* except for the annotation.
			*
			* Although the complete wildcard might not correspond
			* to any node in the schema, we will anchor it on
			* the node of the owner component.
			*/
			tmpWild =  xmlSchemaAddWildcard(pctxt, pctxt->schema,
			    XML_SCHEMA_TYPE_ANY_ATTRIBUTE,
			    WXS_ITEM_NODE(item));
			if (tmpWild == NULL)
			    return(-1);
			if (xmlSchemaCloneWildcardNsConstraints(pctxt,
			    tmpWild, *completeWild) == -1)
			    return (-1);
			tmpWild->processContents = (*completeWild)->processContents;
			*completeWild = tmpWild;
			created = 1;
		    }

		    if (xmlSchemaIntersectWildcards(pctxt, *completeWild,
			gr->attributeWildcard) == -1)
			return(-1);
		}
	    }
	    /*
	    * Just remove the reference if the referenced group does not
	    * contain any attribute uses.
	    */
	    sublist = ((xmlSchemaItemListPtr) gr->attrUses);
	    if ((sublist == NULL) || sublist->nbItems == 0) {
		if (xmlSchemaItemListRemove(list, i) == -1)
		    return(-1);
		i--;
		continue;
	    }
	    /*
	    * Add the attribute uses.
	    */
	    list->items[i] = sublist->items[0];
	    if (sublist->nbItems != 1) {
		for (j = 1; j < sublist->nbItems; j++) {
		    i++;
		    if (xmlSchemaItemListInsert(list,
			    sublist->items[j], i) == -1)
			return(-1);
		}
	    }
	}

    }
    /*
    * Handle pointless prohibitions of declared attributes.
    */
    if (prohibs && (prohibs->nbItems != 0) && (list->nbItems != 0)) {
	xmlSchemaAttributeUseProhibPtr prohib;

	for (i = prohibs->nbItems -1; i >= 0; i--) {
	    prohib = prohibs->items[i];
	    for (j = 0; j < list->nbItems; j++) {
		use = list->items[j];

		if ((prohib->name == WXS_ATTRUSE_DECL_NAME(use)) &&
		    (prohib->targetNamespace == WXS_ATTRUSE_DECL_TNS(use)))
		{
		    xmlChar *str = NULL;

		    xmlSchemaCustomWarning(ACTXT_CAST pctxt,
			XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
			prohib->node, NULL,
			"Skipping pointless attribute use prohibition "
			"'%s', since a corresponding attribute use "
			"exists already in the type definition",
			xmlSchemaFormatQName(&str,
			    prohib->targetNamespace, prohib->name),
			NULL, NULL);
		    FREE_AND_NULL(str);
		    /*
		    * Remove the prohibition.
		    */
		    if (xmlSchemaItemListRemove(prohibs, i) == -1)
			return(-1);
		    break;
		}
	    }
	}
    }
    return(0);
}